

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationsets.cpp
# Opt level: O2

void __thiscall icu_63::TailoredSet::comparePrefixes(TailoredSet *this,UChar32 c,UChar *p,UChar *q)

{
  UErrorCode *errorCode;
  ushort uVar1;
  UBool UVar2;
  int8_t iVar3;
  ushort uVar4;
  UnicodeString *text;
  UnicodeString *pUVar5;
  UnicodeString *this_00;
  ConstChar16Ptr local_190;
  ConstChar16Ptr local_188;
  UChar *local_180;
  UChar *local_170;
  Iterator basePrefixes;
  Iterator prefixes;
  UnicodeString none;
  
  errorCode = &this->errorCode;
  local_188.p_ = p;
  UCharsTrie::Iterator::Iterator(&prefixes,&local_188,0,errorCode);
  local_170 = local_188.p_;
  local_190.p_ = q;
  UCharsTrie::Iterator::Iterator(&basePrefixes,&local_190,0,errorCode);
  local_180 = local_190.p_;
  UnicodeString::UnicodeString(&none,L'\xffff');
  do {
    this_00 = (UnicodeString *)0x0;
    text = (UnicodeString *)0x0;
LAB_0023ffe8:
    if (this_00 == (UnicodeString *)0x0) {
      UVar2 = UCharsTrie::Iterator::next(&prefixes,errorCode);
      this_00 = &none;
      if (UVar2 != '\0') {
        this_00 = &prefixes.str_;
      }
    }
    pUVar5 = text;
    if (text == (UnicodeString *)0x0) {
      UVar2 = UCharsTrie::Iterator::next(&basePrefixes,errorCode);
      text = &basePrefixes.str_;
      pUVar5 = &none;
      if (UVar2 == '\0') goto LAB_00240012;
    }
    else {
LAB_00240012:
      text = pUVar5;
      if ((this_00 == &none) && (pUVar5 == &none)) {
        UnicodeString::~UnicodeString(&none);
        UCharsTrie::Iterator::~Iterator(&basePrefixes);
        UCharsTrie::Iterator::~Iterator(&prefixes);
        return;
      }
    }
    iVar3 = UnicodeString::compare(this_00,text);
    if (iVar3 < '\0') {
      addPrefix(this,this->data,this_00,c,prefixes.value_);
      this_00 = (UnicodeString *)0x0;
      goto LAB_0023ffe8;
    }
    if (iVar3 != '\0') {
      addPrefix(this,this->baseData,text,c,basePrefixes.value_);
      text = (UnicodeString *)0x0;
      goto LAB_0023ffe8;
    }
    setPrefix(this,this_00);
    compare(this,c,prefixes.value_,basePrefixes.value_);
    uVar1 = (this->unreversedPrefix).fUnion.fStackFields.fLengthAndFlags;
    uVar4 = uVar1 & 0x1e;
    if ((uVar1 & 1) != 0) {
      uVar4 = 2;
    }
    (this->unreversedPrefix).fUnion.fStackFields.fLengthAndFlags = uVar4;
  } while( true );
}

Assistant:

void
TailoredSet::comparePrefixes(UChar32 c, const UChar *p, const UChar *q) {
    // Parallel iteration over prefixes of both tables.
    UCharsTrie::Iterator prefixes(p, 0, errorCode);
    UCharsTrie::Iterator basePrefixes(q, 0, errorCode);
    const UnicodeString *tp = NULL;  // Tailoring prefix.
    const UnicodeString *bp = NULL;  // Base prefix.
    // Use a string with a U+FFFF as the limit sentinel.
    // U+FFFF is untailorable and will not occur in prefixes.
    UnicodeString none((UChar)0xffff);
    for(;;) {
        if(tp == NULL) {
            if(prefixes.next(errorCode)) {
                tp = &prefixes.getString();
            } else {
                tp = &none;
            }
        }
        if(bp == NULL) {
            if(basePrefixes.next(errorCode)) {
                bp = &basePrefixes.getString();
            } else {
                bp = &none;
            }
        }
        if(tp == &none && bp == &none) { break; }
        int32_t cmp = tp->compare(*bp);
        if(cmp < 0) {
            // tp occurs in the tailoring but not in the base.
            addPrefix(data, *tp, c, (uint32_t)prefixes.getValue());
            tp = NULL;
        } else if(cmp > 0) {
            // bp occurs in the base but not in the tailoring.
            addPrefix(baseData, *bp, c, (uint32_t)basePrefixes.getValue());
            bp = NULL;
        } else {
            setPrefix(*tp);
            compare(c, (uint32_t)prefixes.getValue(), (uint32_t)basePrefixes.getValue());
            resetPrefix();
            tp = NULL;
            bp = NULL;
        }
    }
}